

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.cpp
# Opt level: O3

size_t __thiscall groundupdbext::HighwayHash::operator()(HighwayHash *this,Bytes *data)

{
  uint64_t *puVar1;
  uint *puVar2;
  uint *puVar3;
  undefined4 uVar4;
  size_t __n;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  long lVar13;
  size_t __n_00;
  HHStateT<1U> *pHVar14;
  HHStatePortable *pHVar15;
  pointer __src;
  HighwayHashCatT<1U> *pHVar16;
  pointer __src_00;
  byte bVar17;
  HHPacket tmp;
  Lanes rotated_keys;
  uint64_t local_120;
  uint64_t uStack_118;
  uint64_t local_110;
  uint64_t uStack_108;
  uint64_t local_100;
  uint64_t uStack_f8;
  uint64_t local_f0;
  uint64_t uStack_e8;
  HHStatePortable local_e0;
  
  bVar17 = 0;
  pHVar16 = this->m_hh;
  lVar13 = 0;
  do {
    puVar1 = this->m_key + lVar13;
    uVar11 = *puVar1;
    uVar4 = *(undefined4 *)((long)puVar1 + 4);
    uVar12 = puVar1[1];
    *(undefined4 *)(local_e0.v0 + lVar13) = uVar4;
    *(int *)((long)local_e0.v0 + lVar13 * 8 + 4) = (int)uVar11;
    *(undefined4 *)(local_e0.v0 + lVar13 + 1) = uVar4;
    *(int *)((long)local_e0.v0 + lVar13 * 8 + 0xc) = (int)uVar12;
    lVar13 = lVar13 + 2;
  } while (lVar13 != 4);
  (pHVar16->state_).mul0[2] = 0x13198a2e03707344;
  (pHVar16->state_).mul0[3] = 0x243f6a8885a308d3;
  (pHVar16->state_).mul0[0] = 0xdbe6d5d5fe4cce2f;
  (pHVar16->state_).mul0[1] = 0xa4093822299f31d0;
  (pHVar16->state_).mul1[0] = 0x3bd39e10cb0ef593;
  (pHVar16->state_).mul1[1] = 0xc0acf169b5f18a8c;
  (pHVar16->state_).mul1[2] = 0xbe5466cf34e90c6c;
  (pHVar16->state_).mul1[3] = 0x452821e638d01377;
  lVar13 = 0;
  do {
    puVar2 = (uint *)((long)this->m_key + lVar13);
    uVar5 = puVar2[1];
    uVar6 = puVar2[2];
    uVar7 = puVar2[3];
    uVar8 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                     lVar13 + 4);
    uVar9 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                     lVar13 + 8);
    uVar10 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                      lVar13 + 0xc);
    puVar3 = (uint *)((long)(pHVar16->state_).v0 + lVar13);
    *puVar3 = *puVar2 ^ *(uint *)(highwayhash::Portable::HHStatePortable::
                                  Reset(unsigned_long_const*)::init0 + lVar13);
    puVar3[1] = uVar5 ^ uVar8;
    puVar3[2] = uVar6 ^ uVar9;
    puVar3[3] = uVar7 ^ uVar10;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x20);
  lVar13 = 0;
  do {
    uVar5 = *(uint *)((long)local_e0.v0 + lVar13 + 4);
    uVar6 = *(uint *)((long)local_e0.v0 + lVar13 + 8);
    uVar7 = *(uint *)((long)local_e0.v0 + lVar13 + 0xc);
    uVar8 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                     lVar13 + 4);
    uVar9 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                     lVar13 + 8);
    uVar10 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                      lVar13 + 0xc);
    puVar2 = (uint *)((long)(pHVar16->state_).v1 + lVar13);
    *puVar2 = *(uint *)((long)local_e0.v0 + lVar13) ^
              *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                       lVar13);
    puVar2[1] = uVar5 ^ uVar8;
    puVar2[2] = uVar6 ^ uVar9;
    puVar2[3] = uVar7 ^ uVar10;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x20);
  pHVar16->buffer_usage_ = 0;
  __src_00 = (data->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if (__src_00 !=
      (data->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pHVar16 = this->m_hh;
      __n = pHVar16->buffer_usage_;
      if (0x20 - __n < 2) {
        pHVar14 = &pHVar16->state_;
        pHVar15 = &local_e0;
        for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
          pHVar15->v0[0] = pHVar14->v0[0];
          pHVar14 = (HHStateT<1U> *)((long)pHVar14 + (ulong)bVar17 * -0x10 + 8);
          pHVar15 = (HHStatePortable *)((long)pHVar15 + ((ulong)bVar17 * -2 + 1) * 8);
        }
        if (__n == 0) {
          pHVar16->buffer_usage_ = 1;
          __n_00 = 1;
          __src = __src_00;
        }
        else {
          memcpy(&local_120,pHVar16,__n);
          if (__n != 0x20) {
            memcpy((void *)((long)&local_120 + __n),__src_00,0x20 - __n);
          }
          local_f0 = local_110;
          uStack_e8 = uStack_108;
          local_100 = local_120;
          uStack_f8 = uStack_118;
          highwayhash::Portable::HHStatePortable::Update(&local_e0,(Lanes *)&local_100);
          __n_00 = __n - 0x1f;
          pHVar16->buffer_usage_ = __n_00;
          pHVar15 = &local_e0;
          pHVar14 = &pHVar16->state_;
          for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
            pHVar14->v0[0] = pHVar15->v0[0];
            pHVar15 = (HHStatePortable *)((long)pHVar15 + (ulong)bVar17 * -0x10 + 8);
            pHVar14 = (HHStateT<1U> *)((long)pHVar14 + (ulong)bVar17 * -0x10 + 8);
          }
          if (__n_00 == 0) goto LAB_00196358;
          __src = __src_00 + (0x20 - __n);
        }
        memcpy(pHVar16,__src,__n_00);
      }
      else {
        pHVar16->buffer_[__n] = *__src_00;
        pHVar16->buffer_usage_ = pHVar16->buffer_usage_ + 1;
      }
LAB_00196358:
      __src_00 = __src_00 + 1;
    } while (__src_00 !=
             (data->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
             super__Vector_impl_data._M_finish);
    pHVar16 = this->m_hh;
  }
  highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>(pHVar16,this->m_result);
  return *this->m_result;
}

Assistant:

std::size_t
HighwayHash::operator() (const groundupdb::Bytes& data) const noexcept {
  m_hh->Reset(m_key);
  for (auto iter = data.begin();iter != data.end();++iter) {
    m_hh->Append((const char*)&*iter,sizeof(*iter));
  }
  m_hh->Finalize(m_result);
  return *m_result;
}